

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::run(Server *this)

{
  int iVar1;
  runtime_error *this_00;
  int *piVar2;
  char *__rhs;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  while( true ) {
    prepare_sets(this);
    iVar1 = select(this->maxfd + 1,(fd_set *)this,(fd_set *)&this->wrfds,(fd_set *)0x0,
                   (timeval *)0x0);
    if (iVar1 < 0) break;
    if (iVar1 != 0) {
      process_pending_clients(this);
      process_waiting_for_handshake(this);
      process_waiting_for_resolve(this);
      process_connections(this);
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_58,"select: ",&local_59);
  piVar2 = __errno_location();
  __rhs = strerror(*piVar2);
  std::operator+(&local_38,&local_58,__rhs);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Server::run() {
    while (true) {
        prepare_sets();
        int selected = select(maxfd + 1, &rdfds, &wrfds, NULL, NULL);
        if (selected < 0) {
            throw std::runtime_error(std::string("select: ") + strerror(errno));
        } else if (selected > 0) {
            process_pending_clients();
            process_waiting_for_handshake();
            process_waiting_for_resolve();
            process_connections();
        }
    }
}